

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

ChTriangleMeshConnected *
chrono::geometry::ChTriangleMeshConnected::Merge
          (ChTriangleMeshConnected *__return_storage_ptr__,
          vector<chrono::geometry::ChTriangleMeshConnected,_std::allocator<chrono::geometry::ChTriangleMeshConnected>_>
          *meshes)

{
  undefined1 auVar1 [64];
  ulong *puVar2;
  long lVar3;
  long lVar4;
  ChTriangleMeshConnected *pCVar5;
  int iVar6;
  long lVar7;
  ulong *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> tmp;
  ChVector<int> v;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> local_e8;
  ChTriangleMeshConnected *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  ChVector<int> local_b8;
  undefined1 local_a8 [16];
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_90;
  vector<chrono::ChColor,std::allocator<chrono::ChColor>> *local_88;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_80;
  vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *local_78;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_70;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_68;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_60;
  vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  (__return_storage_ptr__->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
  auVar1 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_face_n_indices).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar13);
  __return_storage_ptr__->m_vertices =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)auVar1._0_24_;
  __return_storage_ptr__->m_normals =
       (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)auVar1._24_24_;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (__return_storage_ptr__->m_UV).
  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_UV).
    super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->m_face_uv_indices).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  (__return_storage_ptr__->m_filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_filename).field_2;
  (__return_storage_ptr__->m_filename)._M_string_length = 0;
  (__return_storage_ptr__->m_filename).field_2._M_local_buf[0] = '\0';
  local_50 = *(long *)(meshes + 8);
  lVar7 = *(long *)meshes;
  if (lVar7 != local_50) {
    local_68 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
               &__return_storage_ptr__->m_normals;
    local_78 = (vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
               &__return_storage_ptr__->m_UV;
    local_58 = (vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
               &__return_storage_ptr__->m_vertices;
    local_bc = 0;
    iVar6 = 0;
    local_c0 = 0;
    local_c4 = 0;
    local_88 = (vector<chrono::ChColor,std::allocator<chrono::ChColor>> *)
               &__return_storage_ptr__->m_colors;
    local_60 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_v_indices;
    local_70 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_n_indices;
    local_80 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_uv_indices;
    local_90 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
               &__return_storage_ptr__->m_face_col_indices;
    local_d0 = __return_storage_ptr__;
    do {
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>>
                (local_58,(__return_storage_ptr__->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar7 + 8),
                 *(undefined8 *)(lVar7 + 0x10));
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_e8,
                 (*(long *)(lVar7 + 0x70) - *(long *)(lVar7 + 0x68) >> 2) * -0x5555555555555555);
      puVar8 = *(ulong **)(lVar7 + 0x68);
      puVar2 = *(ulong **)(lVar7 + 0x70);
      if (puVar8 != puVar2) {
        local_a8 = vpbroadcastd_avx512vl();
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *puVar8;
          auVar9 = vpaddd_avx(auVar9,local_a8);
          local_b8.m_data._0_8_ = auVar9._0_8_;
          local_b8.m_data[2] = (int)puVar8[1] + local_bc;
          std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
          emplace_back<chrono::ChVector<int>>
                    ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                     &local_e8,&local_b8);
          puVar8 = (ulong *)((long)puVar8 + 0xc);
        } while (puVar8 != puVar2);
      }
      pCVar5 = local_d0;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_60,(local_d0->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar3 = *(long *)(lVar7 + 0x10);
      lVar4 = *(long *)(lVar7 + 8);
      if (local_e8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<double>*,std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>>>
                (local_68,(pCVar5->m_normals).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar7 + 0x20),
                 *(undefined8 *)(lVar7 + 0x28));
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38 = lVar3 - lVar4;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_e8,
                 (*(long *)(lVar7 + 0x88) - *(long *)(lVar7 + 0x80) >> 2) * -0x5555555555555555);
      puVar8 = *(ulong **)(lVar7 + 0x80);
      puVar2 = *(ulong **)(lVar7 + 0x88);
      if (puVar8 != puVar2) {
        local_a8 = vpbroadcastd_avx512vl();
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *puVar8;
          auVar9 = vpaddd_avx(auVar10,local_a8);
          local_b8.m_data._0_8_ = auVar9._0_8_;
          local_b8.m_data[2] = (int)puVar8[1] + local_c0;
          std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
          emplace_back<chrono::ChVector<int>>
                    ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                     &local_e8,&local_b8);
          puVar8 = (ulong *)((long)puVar8 + 0xc);
        } while (puVar8 != puVar2);
      }
      pCVar5 = local_d0;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_70,(local_d0->m_face_n_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar3 = *(long *)(lVar7 + 0x28);
      lVar4 = *(long *)(lVar7 + 0x20);
      if (local_e8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>>
                (local_78,(pCVar5->m_UV).
                          super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar7 + 0x38),
                 *(undefined8 *)(lVar7 + 0x40));
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40 = lVar3 - lVar4;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_e8,
                 (*(long *)(lVar7 + 0xa0) - *(long *)(lVar7 + 0x98) >> 2) * -0x5555555555555555);
      puVar8 = *(ulong **)(lVar7 + 0x98);
      puVar2 = *(ulong **)(lVar7 + 0xa0);
      if (puVar8 != puVar2) {
        local_a8 = vpbroadcastd_avx512vl();
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *puVar8;
          auVar9 = vpaddd_avx(auVar11,local_a8);
          local_b8.m_data._0_8_ = auVar9._0_8_;
          local_b8.m_data[2] = (int)puVar8[1] + local_c4;
          std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
          emplace_back<chrono::ChVector<int>>
                    ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                     &local_e8,&local_b8);
          puVar8 = (ulong *)((long)puVar8 + 0xc);
        } while (puVar8 != puVar2);
      }
      pCVar5 = local_d0;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_80,(local_d0->m_face_uv_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar3 = *(long *)(lVar7 + 0x40);
      lVar4 = *(long *)(lVar7 + 0x38);
      if (local_e8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChColor*,std::vector<chrono::ChColor,std::allocator<chrono::ChColor>>>>
                (local_88,(pCVar5->m_colors).
                          super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
                          _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar7 + 0x50),
                 *(undefined8 *)(lVar7 + 0x58));
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48 = lVar3 - lVar4;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::reserve
                (&local_e8,
                 (*(long *)(lVar7 + 0xb8) - *(long *)(lVar7 + 0xb0) >> 2) * -0x5555555555555555);
      puVar8 = *(ulong **)(lVar7 + 0xb0);
      puVar2 = *(ulong **)(lVar7 + 0xb8);
      if (puVar8 != puVar2) {
        local_a8 = vpbroadcastd_avx512vl();
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *puVar8;
          auVar9 = vpaddd_avx(auVar12,local_a8);
          local_b8.m_data._0_8_ = auVar9._0_8_;
          local_b8.m_data[2] = (int)puVar8[1] + iVar6;
          std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
          emplace_back<chrono::ChVector<int>>
                    ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                     &local_e8,&local_b8);
          puVar8 = (ulong *)((long)puVar8 + 0xc);
        } while (puVar8 != puVar2);
      }
      __return_storage_ptr__ = local_d0;
      std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<chrono::ChVector<int>*,std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>>>
                (local_90,(local_d0->m_face_col_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      lVar3 = *(long *)(lVar7 + 0x58);
      lVar4 = *(long *)(lVar7 + 0x50);
      if (local_e8.
          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar7 = lVar7 + 0x100;
      iVar6 = iVar6 + (int)((ulong)(lVar3 - lVar4) >> 2) * -0x55555555;
      local_bc = local_bc + (int)(local_38 >> 3) * -0x55555555;
      local_c0 = local_c0 + (int)(local_40 >> 3) * -0x55555555;
      local_c4 = local_c4 + (int)(local_48 >> 4);
    } while (lVar7 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

ChTriangleMeshConnected ChTriangleMeshConnected::Merge(std::vector<ChTriangleMeshConnected>& meshes) {
    ChTriangleMeshConnected trimesh;
    auto& vertices = trimesh.m_vertices;
    auto& normals = trimesh.m_normals;
    auto& uvs = trimesh.m_UV;
    auto& colors = trimesh.m_colors;
    auto& idx_vertices = trimesh.m_face_v_indices;
    auto& idx_normals = trimesh.m_face_n_indices;
    auto& idx_uvs = trimesh.m_face_uv_indices;
    auto& idx_colors = trimesh.m_face_col_indices;

    int v_off = 0;
    int n_off = 0;
    int uv_off = 0;
    int c_off = 0;
    for (auto& m : meshes) {
        {
            vertices.insert(vertices.end(), m.m_vertices.begin(), m.m_vertices.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_v_indices.size());
            std::transform(m.m_face_v_indices.begin(), m.m_face_v_indices.end(), std::back_inserter(tmp),
                           [&v_off](ChVector<int>& a) { return a + v_off; });
            idx_vertices.insert(idx_vertices.end(), tmp.begin(), tmp.end());
            v_off += static_cast<int>(m.m_vertices.size());
        }

        {
            normals.insert(normals.end(), m.m_normals.begin(), m.m_normals.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_n_indices.size());
            std::transform(m.m_face_n_indices.begin(), m.m_face_n_indices.end(), std::back_inserter(tmp),
                           [&n_off](ChVector<int>& a) { return a + n_off; });
            idx_normals.insert(idx_normals.end(), tmp.begin(), tmp.end());
            n_off += static_cast<int>(m.m_normals.size());
        }

        {
            uvs.insert(uvs.end(), m.m_UV.begin(), m.m_UV.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_uv_indices.size());
            std::transform(m.m_face_uv_indices.begin(), m.m_face_uv_indices.end(), std::back_inserter(tmp),
                           [&uv_off](ChVector<int>& a) { return a + uv_off; });
            idx_uvs.insert(idx_uvs.end(), tmp.begin(), tmp.end());
            uv_off += static_cast<int>(m.m_UV.size());
        }

        {
            colors.insert(colors.end(), m.m_colors.begin(), m.m_colors.end());
            std::vector<ChVector<int>> tmp;
            tmp.reserve(m.m_face_col_indices.size());
            std::transform(m.m_face_col_indices.begin(), m.m_face_col_indices.end(), std::back_inserter(tmp),
                           [&c_off](ChVector<int>& a) { return a + c_off; });
            idx_colors.insert(idx_colors.end(), tmp.begin(), tmp.end());
            c_off += static_cast<int>(m.m_colors.size());
        }
    }

    return trimesh;
}